

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestFilter.cpp
# Opt level: O2

SimpleString __thiscall TestFilter::asString(TestFilter *this)

{
  char cVar1;
  char *pcVar2;
  SimpleString *in_RSI;
  
  pcVar2 = SimpleString::asCharString(in_RSI);
  StringFromFormat((char *)this,"TestFilter: \"%s\"",pcVar2);
  cVar1 = *(char *)((long)&in_RSI[1].buffer_ + 1);
  if (*(char *)&in_RSI[1].buffer_ == '\x01') {
    pcVar2 = " with strict matching";
    if (cVar1 != '\0') {
      pcVar2 = " with strict, invert matching";
    }
  }
  else {
    if (cVar1 == '\0') {
      return (SimpleString)(char *)this;
    }
    pcVar2 = " with invert matching";
  }
  SimpleString::operator+=(&this->filter_,pcVar2);
  return (SimpleString)(char *)this;
}

Assistant:

SimpleString TestFilter::asString() const
{
    SimpleString textFilter =  StringFromFormat("TestFilter: \"%s\"", filter_.asCharString());
    if (strictMatching_ && invertMatching_)
        textFilter += " with strict, invert matching";
    else if (strictMatching_)
        textFilter += " with strict matching";
    else if (invertMatching_)
        textFilter += " with invert matching";

    return textFilter;
}